

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread_test.c
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  RK_S64 time_end;
  RK_S64 time_start;
  void *dummy;
  undefined1 local_c0 [4];
  pthread_mutexattr_t mutex_attr;
  pthread_attr_t attr;
  pthread_t threads [10];
  int pdata [10];
  int i;
  
  _mpp_log_l(4,"mpp_thread_test","vpu test start\n",0);
  pthread_attr_init((pthread_attr_t *)local_c0);
  pthread_attr_setdetachstate((pthread_attr_t *)local_c0,0);
  for (pdata[8] = 0; pdata[8] < 10; pdata[8] = pdata[8] + 1) {
    pdata[(long)pdata[8] + -2] = pdata[8];
    pthread_create(threads + (long)pdata[8] + -1,(pthread_attr_t *)local_c0,thread_test,
                   pdata + (long)pdata[8] + -2);
  }
  sleep(2);
  for (pdata[8] = 0; pdata[8] < 10; pdata[8] = pdata[8] + 1) {
    pthread_join(threads[(long)pdata[8] + -1],(void **)&time_start);
  }
  _mpp_debug = 1;
  uVar1 = mpp_time();
  for (pdata[8] = 0; pdata[8] < 10000; pdata[8] = pdata[8] + 1) {
    mutex_performance_test_once();
  }
  uVar2 = mpp_time();
  mpp_time_diff(uVar1,uVar2,0,"lock unlock test");
  pthread_mutexattr_init((pthread_mutexattr_t *)((long)&dummy + 4));
  pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&dummy + 4),1);
  pthread_mutex_init((pthread_mutex_t *)&mutex_0,(pthread_mutexattr_t *)((long)&dummy + 4));
  pthread_mutex_init((pthread_mutex_t *)&mutex_1,(pthread_mutexattr_t *)((long)&dummy + 4));
  pthread_cond_init((pthread_cond_t *)&cond_0,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&cond_1,(pthread_condattr_t *)0x0);
  pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&dummy + 4));
  uVar1 = mpp_time();
  pthread_create((pthread_t *)(attr.__size + 0x30),(pthread_attr_t *)local_c0,
                 mutex_performance_test_loop_0,(void *)0x0);
  flag_0 = 0;
  pthread_create(threads,(pthread_attr_t *)local_c0,mutex_performance_test_loop_1,(void *)0x0);
  pthread_join(attr._48_8_,(void **)&time_start);
  pthread_join(threads[0],(void **)&time_start);
  uVar2 = mpp_time();
  mpp_time_diff(uVar1,uVar2,0,"lock and signal test");
  pthread_cond_destroy((pthread_cond_t *)&cond_0);
  pthread_cond_destroy((pthread_cond_t *)&cond_1);
  pthread_attr_destroy((pthread_attr_t *)local_c0);
  _mpp_debug = 0;
  _mpp_log_l(4,"mpp_thread_test","vpu test end\n",0);
  return 0;
}

Assistant:

int main()
{
    int i;
    int pdata[MAX_THREAD_NUM];
    pthread_t threads[MAX_THREAD_NUM];
    pthread_attr_t attr;
    pthread_mutexattr_t mutex_attr;
    void *dummy;
    RK_S64 time_start, time_end;

    mpp_log("vpu test start\n");
    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    for (i = 0; i < MAX_THREAD_NUM; i++) {
        pdata[i] = i;
        pthread_create(&threads[i], &attr, thread_test, &pdata[i]);
    }

    sleep(2);

    for (i = 0; i < MAX_THREAD_NUM; i++) {
        pthread_join(threads[i], &dummy);
    }

    mpp_debug = MPP_DBG_TIMING;
    time_start = mpp_time();

    for (i = 0; i < MAX_LOCK_LOOP; i++)
        mutex_performance_test_once();

    time_end = mpp_time();
    mpp_time_diff(time_start, time_end, 0, "lock unlock test");

    pthread_mutexattr_init(&mutex_attr);
    pthread_mutexattr_settype(&mutex_attr, PTHREAD_MUTEX_RECURSIVE);

    pthread_mutex_init(&mutex_0, &mutex_attr);
    pthread_mutex_init(&mutex_1, &mutex_attr);
    pthread_cond_init(&cond_0, NULL);
    pthread_cond_init(&cond_1, NULL);
    pthread_mutexattr_destroy(&mutex_attr);

    time_start = mpp_time();
    pthread_create(&threads[0], &attr, mutex_performance_test_loop_0, NULL);
    flag_0 = 0;
    pthread_create(&threads[1], &attr, mutex_performance_test_loop_1, NULL);

    pthread_join(threads[0], &dummy);
    pthread_join(threads[1], &dummy);
    time_end = mpp_time();
    mpp_time_diff(time_start, time_end, 0, "lock and signal test");

    pthread_cond_destroy(&cond_0);
    pthread_cond_destroy(&cond_1);

    pthread_attr_destroy(&attr);

    mpp_debug = 0;
    mpp_log("vpu test end\n");
    return 0;
}